

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O2

bool __thiscall
QGraphicsAnchorLayoutPrivate::calculateNonTrunk
          (QGraphicsAnchorLayoutPrivate *this,QList<QSimplexConstraint_*> *constraints,
          QList<QtGraphicsAnchorLayout::AnchorData_*> *variables)

{
  AnchorData **ppAVar1;
  long lVar2;
  AnchorData *pAVar3;
  bool bVar4;
  long lVar5;
  QGraphicsAnchorLayoutPrivate *this_00;
  
  this_00 = (QGraphicsAnchorLayoutPrivate *)constraints;
  shiftConstraints(constraints,16777215.0);
  bVar4 = solvePreferred(this_00,constraints,variables);
  if (bVar4) {
    ppAVar1 = (variables->d).ptr;
    lVar2 = (variables->d).size;
    for (lVar5 = 0; lVar2 != lVar5; lVar5 = lVar5 + 1) {
      pAVar3 = ppAVar1[lVar5];
      pAVar3->sizeAtMinimum = pAVar3->sizeAtPreferred;
      pAVar3->sizeAtMaximum = pAVar3->sizeAtPreferred;
    }
  }
  shiftConstraints(constraints,-16777215.0);
  return bVar4;
}

Assistant:

bool QGraphicsAnchorLayoutPrivate::calculateNonTrunk(const QList<QSimplexConstraint *> &constraints,
                                                     const QList<AnchorData *> &variables)
{
    shiftConstraints(constraints, g_offset);
    bool feasible = solvePreferred(constraints, variables);

    if (feasible) {
        // Propagate size at preferred to other sizes. Semi-floats always will be
        // in their sizeAtPreferred.
        for (int j = 0; j < variables.size(); ++j) {
            AnchorData *ad = variables.at(j);
            Q_ASSERT(ad);
            ad->sizeAtMinimum = ad->sizeAtPreferred;
            ad->sizeAtMaximum = ad->sizeAtPreferred;
        }
    }

    shiftConstraints(constraints, -g_offset);
    return feasible;
}